

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_ec.cc
# Opt level: O3

int pkey_ec_paramgen(EVP_PKEY_CTX *ctx,EVP_PKEY *pkey)

{
  void *pvVar1;
  int iVar2;
  EC_KEY *key;
  
  pvVar1 = ctx->data;
  if (*(long *)((long)pvVar1 + 8) == 0) {
    ERR_put_error(6,0,0x7c,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_ec.cc"
                  ,0xbc);
  }
  else {
    key = (EC_KEY *)EC_KEY_new();
    if ((key != (EC_KEY *)0x0) &&
       (iVar2 = EC_KEY_set_group((EC_KEY *)key,*(EC_GROUP **)((long)pvVar1 + 8)), iVar2 != 0)) {
      EVP_PKEY_assign_EC_KEY(pkey,key);
      return 1;
    }
    EC_KEY_free((EC_KEY *)key);
  }
  return 0;
}

Assistant:

static int pkey_ec_paramgen(EVP_PKEY_CTX *ctx, EVP_PKEY *pkey) {
  EC_PKEY_CTX *dctx = reinterpret_cast<EC_PKEY_CTX *>(ctx->data);
  if (dctx->gen_group == NULL) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_NO_PARAMETERS_SET);
    return 0;
  }
  EC_KEY *ec = EC_KEY_new();
  if (ec == NULL || !EC_KEY_set_group(ec, dctx->gen_group)) {
    EC_KEY_free(ec);
    return 0;
  }
  EVP_PKEY_assign_EC_KEY(pkey, ec);
  return 1;
}